

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QDBusMenuEvent>::copyAppend
          (QGenericArrayOps<QDBusMenuEvent> *this,QDBusMenuEvent *b,QDBusMenuEvent *e)

{
  qsizetype *pqVar1;
  QDBusMenuEvent *pQVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QDBusMenuEvent>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QDBusMenuEvent>).size;
      pQVar2[lVar3].m_id = b->m_id;
      pDVar4 = (b->m_eventId).d.d;
      pQVar2[lVar3].m_eventId.d.d = pDVar4;
      pQVar2[lVar3].m_eventId.d.ptr = (b->m_eventId).d.ptr;
      pQVar2[lVar3].m_eventId.d.size = (b->m_eventId).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&pQVar2[lVar3].m_data.m_variant,&(b->m_data).m_variant);
      pQVar2[lVar3].m_timestamp = b->m_timestamp;
      pqVar1 = &(this->super_QArrayDataPointer<QDBusMenuEvent>).size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }